

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

bool __thiscall Table::in_escape_chars(Table *this,char *ch)

{
  bool bVar1;
  long *plVar2;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  long *plVar3;
  _Rb_tree_header *p_Var4;
  long **local_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  __it._M_node = (this->escape_chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_48,0,0,'\x01');
  p_Var4 = &(this->escape_chars)._M_t._M_impl.super__Rb_tree_header;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  local_70 = &local_68;
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((_Rb_tree_header *)__it._M_node != p_Var4) {
    do {
      bVar1 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                        ((_Iter_equals_val<std::__cxx11::string_const> *)&local_70,__it);
      if (bVar1) break;
      __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
    } while ((_Rb_tree_header *)__it._M_node != p_Var4);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return (_Rb_tree_header *)__it._M_node != p_Var4;
}

Assistant:

bool Table::in_escape_chars(const char &ch) {
    return std::find(escape_chars.begin(), escape_chars.end(), std::string() + ch) != escape_chars.end();
}